

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O2

bool __thiscall CSemaphore::try_wait(CSemaphore *this)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&this->mutex);
  iVar1 = this->value;
  if (0 < iVar1) {
    this->value = iVar1 + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return 0 < iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool try_wait() noexcept
    {
        std::lock_guard<std::mutex> lock(mutex);
        if (value < 1) {
            return false;
        }
        value--;
        return true;
    }